

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProfiler.cpp
# Opt level: O2

bool __thiscall chrono::utils::ChProfileNode::Return(ChProfileNode *this)

{
  int iVar1;
  unsigned_long_long uVar2;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  
  auVar3 = in_ZMM0._0_16_;
  iVar1 = this->RecursionCounter + -1;
  this->RecursionCounter = iVar1;
  if ((iVar1 == 0) && (this->TotalCalls != 0)) {
    uVar2 = ChTimer<double>::GetTimeMicrosecondsIntermediate((ChTimer<double> *)gProfileClock);
    auVar3 = vcvtusi2ss_avx512f(auVar3,uVar2 - this->StartTime);
    this->TotalTime = auVar3._0_4_ / 1000.0 + this->TotalTime;
    iVar1 = this->RecursionCounter;
  }
  return iVar1 == 0;
}

Assistant:

bool	ChProfileNode::Return( void )
{
	if ( --RecursionCounter == 0 && TotalCalls != 0 ) { 
		unsigned long int time;
		Profile_Get_Ticks(&time);
		time-=StartTime;
		TotalTime += (float)time / Profile_Get_Tick_Rate();
	}
	return ( RecursionCounter == 0 );
}